

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_gc_check(ASMState *as)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  MCode *pMVar4;
  uint uVar5;
  IRRef args [2];
  IRRef local_20 [2];
  
  ra_evictset(as,0xffff0fc7);
  uVar3 = *(undefined4 *)&as->mcp;
  asm_guardcc(as,5);
  pMVar4 = as->mcp;
  pMVar4[-2] = 0x85;
  pMVar4[-1] = 0xc0;
  as->mcp = pMVar4 + -2;
  local_20[0] = 0x7ffd;
  local_20[1] = 0x7ffe;
  asm_gencall(as,lj_ir_callinfo + 0x2c,local_20);
  bVar1 = *(byte *)((long)as->ir + 0x3ffee);
  uVar5 = 1 << (bVar1 & 0x1f);
  as->freeset = as->freeset | uVar5;
  as->modset = as->modset | uVar5;
  *(undefined1 *)((long)as->ir + 0x3ffee) = 0xff;
  pMVar4 = as->mcp;
  pMVar4[-4] = 'X';
  pMVar4[-3] = 0xf0;
  pMVar4[-2] = 0xff;
  pMVar4[-1] = 0xff;
  pMVar4[-5] = bVar1 * '\b' & 0x38 | 0x86;
  pMVar4[-6] = 0x8d;
  pMVar4[-7] = bVar1 >> 1 & 4 | 0x49;
  as->mcp = pMVar4 + -7;
  bVar2 = *(byte *)((long)as->ir + 0x3fff6);
  uVar5 = 1 << (bVar2 & 0x1f);
  as->freeset = as->freeset | uVar5;
  as->modset = as->modset | uVar5;
  *(undefined1 *)((long)as->ir + 0x3fff6) = 0xff;
  emit_loadi(as,(uint)bVar2,as->gcsteps);
  pMVar4 = as->mcp;
  pMVar4[-1] = (char)uVar3 - (char)pMVar4;
  pMVar4[-2] = 'r';
  as->mcp = pMVar4 + -2;
  emit_rma(as,XO_CMP,bVar1 | 0x80200,as->J[-1].penalty + 0x26);
  emit_rma(as,XO_MOV,bVar1 | 0x80200,&as->J[-1].penalty[0x25].val);
  as->gcsteps = 0;
  if (as->mclim <= as->mcp) {
    return;
  }
  asm_mclimit(as);
}

Assistant:

static void asm_gc_check(ASMState *as)
{
  const CCallInfo *ci = &lj_ir_callinfo[IRCALL_lj_gc_step_jit];
  IRRef args[2];
  MCLabel l_end;
  Reg tmp;
  ra_evictset(as, RSET_SCRATCH);
  l_end = emit_label(as);
  /* Exit trace if in GCSatomic or GCSfinalize. Avoids syncing GC objects. */
  asm_guardcc(as, CC_NE);  /* Assumes asm_snap_prep() already done. */
  emit_rr(as, XO_TEST, RID_RET, RID_RET);
  args[0] = ASMREF_TMP1;  /* global_State *g */
  args[1] = ASMREF_TMP2;  /* MSize steps     */
  asm_gencall(as, ci, args);
  tmp = ra_releasetmp(as, ASMREF_TMP1);
#if LJ_GC64
  emit_rmro(as, XO_LEA, tmp|REX_64, RID_DISPATCH, GG_DISP2G);
#else
  emit_loada(as, tmp, J2G(as->J));
#endif
  emit_loadi(as, ra_releasetmp(as, ASMREF_TMP2), as->gcsteps);
  /* Jump around GC step if GC total < GC threshold. */
  emit_sjcc(as, CC_B, l_end);
  emit_opgl(as, XO_ARITH(XOg_CMP), tmp|REX_GC64, gc.threshold);
  emit_getgl(as, tmp, gc.total);
  as->gcsteps = 0;
  checkmclim(as);
}